

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O1

clip_image_size
llava_uhd::get_best_resize
          (clip_image_size *original_size,int scale_resolution,int patch_size,bool allow_upscale)

{
  int iVar1;
  int iVar2;
  clip_image_size cVar3;
  float fVar4;
  float fVar5;
  
  iVar1 = original_size->width;
  iVar2 = original_size->height;
  if (scale_resolution * scale_resolution < iVar2 * iVar1 || allow_upscale) {
    fVar5 = (float)iVar1 / (float)iVar2;
    if (fVar5 < 0.0) {
      fVar4 = sqrtf(fVar5);
    }
    else {
      fVar4 = SQRT(fVar5);
    }
    iVar2 = (int)((float)scale_resolution / fVar4);
    iVar1 = (int)(fVar5 * (float)(int)((float)scale_resolution / fVar4));
  }
  fVar4 = (float)patch_size;
  fVar5 = roundf((float)iVar1 / fVar4);
  iVar1 = (int)(fVar5 * fVar4);
  if ((int)(fVar5 * fVar4) <= patch_size) {
    iVar1 = patch_size;
  }
  fVar5 = roundf((float)iVar2 / fVar4);
  if (patch_size < (int)(fVar5 * fVar4)) {
    patch_size = (int)(fVar5 * fVar4);
  }
  cVar3.height = patch_size;
  cVar3.width = iVar1;
  return cVar3;
}

Assistant:

static clip_image_size get_best_resize(const clip_image_size & original_size, int scale_resolution, int patch_size, bool allow_upscale = false) {
        int width  = original_size.width;
        int height = original_size.height;
        if ((width * height > scale_resolution * scale_resolution) || allow_upscale) {
            float r = static_cast<float>(width) / height;
            height  = static_cast<int>(scale_resolution / std::sqrt(r));
            width   = static_cast<int>(height * r);
        }
        clip_image_size res;
        res.width  = ensure_divide(width,  patch_size);
        res.height = ensure_divide(height, patch_size);
        return res;
    }